

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_inst.c
# Opt level: O2

void callExternalFunc(vm *v,function *f)

{
  uint64 uVar1;
  int i;
  uint uVar2;
  stack pr_stack;
  stack local_40;
  
  initStack(&local_40);
  for (uVar2 = 0; uVar2 < (f->tp).param_count; uVar2 = uVar2 + 1) {
    uVar1 = popU64(&v->operandStack);
    pushU64(&local_40,uVar1);
  }
  (*f->native)(&local_40);
  for (uVar2 = 0; uVar2 < (f->tp).return_count; uVar2 = uVar2 + 1) {
    uVar1 = popU64(&local_40);
    pushU64(&v->operandStack,uVar1);
  }
  freeStack(&local_40);
  return;
}

Assistant:

void callExternalFunc(vm *v, function *f) {
    stack pr_stack;
    initStack(&pr_stack);
    for (int i = 0; i < f->tp.param_count; ++i) {
        pushU64(&pr_stack, popU64(&v->operandStack));
    }
    f->native(&pr_stack);
    for (int i = 0; i < f->tp.return_count; ++i) {
        pushU64(&v->operandStack, popU64(&pr_stack));
    }
    freeStack(&pr_stack);
}